

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O0

bool __thiscall VcprojGenerator::writeMakefile(VcprojGenerator *this,QTextStream *t)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  long *in_RDI;
  long in_FS_OFFSET;
  XmlOutput xmlOut;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  XmlOutput *in_stack_fffffffffffffdc0;
  QString *config;
  QMakeProject *in_stack_fffffffffffffdc8;
  QMakeProject *this_00;
  undefined6 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  QMakeEvaluator *in_stack_fffffffffffffdd8;
  QMakeEvaluator *this_01;
  ProString *in_stack_fffffffffffffde0;
  ProString *this_02;
  byte local_211;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  bool local_1d1;
  undefined1 local_1b8 [24];
  QTextStream *in_stack_fffffffffffffef8;
  VcprojGenerator *in_stack_ffffffffffffff00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*in_RDI + 0x150))();
  ProKey::ProKey((ProKey *)in_stack_fffffffffffffdc0,
                 (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
  QMakeEvaluator::first
            (in_stack_fffffffffffffdd8,
             (ProKey *)
             CONCAT17(in_stack_fffffffffffffdd7,
                      CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
  bVar2 = ProString::operator==(in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
  ProString::~ProString((ProString *)0x28735d);
  ProKey::~ProKey((ProKey *)0x28736a);
  if (bVar2) {
    QString::QString((QString *)in_stack_fffffffffffffdc8,
                     (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    bVar2 = QMakeProject::isActiveConfig
                      (in_stack_fffffffffffffdc8,(QString *)in_stack_fffffffffffffdc0,
                       (bool)in_stack_fffffffffffffdbf);
    bVar3 = bVar2 ^ 0xff;
    QString::~QString((QString *)0x2873c3);
    if ((bVar3 & 1) == 0) {
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Not writing solution file for build_pass configs"
                          );
      }
    }
    else {
      if (Option::debug_level != 0) {
        debug_msg_internal(1,"Generator: MSVC.NET: Writing solution file");
      }
      writeSubDirs(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    local_1d1 = true;
  }
  else {
    this_02 = (ProString *)in_RDI[0x1b];
    ProKey::ProKey((ProKey *)in_stack_fffffffffffffdc0,
                   (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
    QMakeEvaluator::first
              (in_stack_fffffffffffffdd8,
               (ProKey *)
               CONCAT17(in_stack_fffffffffffffdd7,
                        CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
    bVar2 = ProString::operator==(this_02,(char *)in_stack_fffffffffffffdd8);
    local_211 = 1;
    if (!bVar2) {
      this_01 = (QMakeEvaluator *)in_RDI[0x1b];
      ProKey::ProKey((ProKey *)in_stack_fffffffffffffdc0,
                     (char *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
      QMakeEvaluator::first
                (this_01,(ProKey *)
                         CONCAT17(in_stack_fffffffffffffdd7,
                                  CONCAT16(in_stack_fffffffffffffdd6,in_stack_fffffffffffffdd0)));
      local_211 = ProString::operator==(this_02,(char *)this_01);
      ProString::~ProString((ProString *)0x287511);
      ProKey::~ProKey((ProKey *)0x287527);
    }
    ProString::~ProString((ProString *)0x287534);
    ProKey::~ProKey((ProKey *)0x287541);
    if ((local_211 & 1) == 0) {
      config = (QString *)in_RDI[0x1b];
      QString::QString((QString *)in_stack_fffffffffffffdc8,
                       (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      local_1d1 = QMakeProject::isActiveConfig
                            (in_stack_fffffffffffffdc8,config,(bool)in_stack_fffffffffffffdbf);
      QString::~QString((QString *)0x28766b);
    }
    else {
      this_00 = (QMakeProject *)in_RDI[0x1b];
      QString::QString((QString *)this_00,
                       (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      bVar2 = QMakeProject::isActiveConfig
                        (this_00,(QString *)in_stack_fffffffffffffdc0,
                         (bool)in_stack_fffffffffffffdbf);
      bVar3 = bVar2 ^ 0xff;
      QString::~QString((QString *)0x28759a);
      if ((bVar3 & 1) != 0) {
        if (Option::debug_level != 0) {
          debug_msg_internal(1,"Generator: MSVC.NET: Writing single configuration project file");
        }
        memset(local_1b8,0xaa,0x60);
        XmlOutput::XmlOutput
                  ((XmlOutput *)CONCAT17(local_211,CONCAT16(bVar3,in_stack_fffffffffffffdd0)),
                   (QTextStream *)this_00,
                   (ConverstionType)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        (**(code **)(*(long *)in_RDI[0x33] + 0x10))((long *)in_RDI[0x33],local_1b8,in_RDI + 0x35);
        XmlOutput::~XmlOutput(in_stack_fffffffffffffdc0);
      }
      local_1d1 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1d1;
  }
  __stack_chk_fail();
}

Assistant:

bool VcprojGenerator::writeMakefile(QTextStream &t)
{
    initProject(); // Fills the whole project with proper data

    // Generate solution file
    if(project->first("TEMPLATE") == "vcsubdirs") {
        if (!project->isActiveConfig("build_pass")) {
            debug_msg(1, "Generator: MSVC.NET: Writing solution file");
            writeSubDirs(t);
        } else {
            debug_msg(1, "Generator: MSVC.NET: Not writing solution file for build_pass configs");
        }
        return true;
    } else
    // Generate single configuration project file
    if (project->first("TEMPLATE") == "vcapp" ||
        project->first("TEMPLATE") == "vclib") {
        if(!project->isActiveConfig("build_pass")) {
            debug_msg(1, "Generator: MSVC.NET: Writing single configuration project file");
            XmlOutput xmlOut(t);
            projectWriter->write(xmlOut, vcProject);
        }
        return true;
    }
    return project->isActiveConfig("build_pass");
}